

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_stress.c
# Opt level: O1

void server(void *arg)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *buf;
  int res [10];
  int aiStack_14c [59];
  code *pcStack_60;
  byte *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  pcStack_60 = (code *)0x10184a;
  iVar2 = nn_socket(1,0x51);
  if (-1 < iVar2) {
    pcStack_60 = (code *)0x101862;
    iVar3 = nn_bind(iVar2,"ipc://test-stress.ipc");
    if (iVar3 < 0) goto LAB_00101921;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_28 = 0;
    uVar4 = 0x65;
    while( true ) {
      local_50 = (byte *)0x0;
      pcStack_60 = (code *)0x1018a6;
      iVar3 = nn_recv(iVar2,&local_50,0xffffffffffffffff,0);
      if (iVar3 < 0) break;
      if (iVar3 < 2) goto LAB_00101908;
      bVar1 = *local_50;
      if ((byte)(bVar1 + 0xa5) < 0xe6) goto LAB_0010190d;
      iVar3 = (int)(char)local_50[1];
      if (iVar3 < 0x61) {
        pcStack_60 = (code *)0x101903;
        server_cold_3();
        break;
      }
      if ('J' < (char)bVar1) goto LAB_00101912;
      if (aiStack_14c[bVar1] != iVar3 + -0x61) goto LAB_00101917;
      aiStack_14c[bVar1] = iVar3 + -0x60;
      pcStack_60 = (code *)0x1018e7;
      nn_freemsg();
      uVar4 = uVar4 - 1;
      if (uVar4 < 2) {
        pcStack_60 = (code *)0x1018f5;
        nn_close(iVar2);
        return;
      }
    }
    pcStack_60 = (code *)0x101908;
    server_cold_6();
LAB_00101908:
    pcStack_60 = (code *)0x10190d;
    server_cold_5();
LAB_0010190d:
    pcStack_60 = (code *)0x101912;
    server_cold_4();
LAB_00101912:
    pcStack_60 = (code *)0x101917;
    server_cold_2();
LAB_00101917:
    pcStack_60 = (code *)0x10191c;
    server_cold_1();
  }
  pcStack_60 = (code *)0x101921;
  server_cold_8();
LAB_00101921:
  pcStack_60 = client;
  server_cold_7();
}

Assistant:

static void server(NN_UNUSED void *arg)
{
    int bytes;
    int count;
    int sock = nn_socket(AF_SP, NN_PULL);
    int res[TEST_LOOPS];
    nn_assert(sock >= 0);
    nn_assert(nn_bind(sock, SOCKET_ADDRESS) >= 0);
    count = THREAD_COUNT * TEST_LOOPS;
    memset(res, 0, sizeof (res));
    while (count > 0)
    {
        char *buf = NULL;
        int tid;
        int num;
        bytes = nn_recv(sock, &buf, NN_MSG, 0);
        nn_assert(bytes >= 0);
        nn_assert(bytes >= 2);
        nn_assert(buf[0] >= 'A' && buf[0] <= 'Z');
        nn_assert(buf[1] >= 'a' && buf[0] <= 'z');
        tid = buf[0]-'A';
        num = buf[1]-'a';
        nn_assert(tid < THREAD_COUNT);
        nn_assert(res[tid] == num);
        res[tid]=num+1;
        nn_freemsg(buf);
        count--;
    }
    nn_close(sock);
}